

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_modsub(mp_int *x,mp_int *y,mp_int *modulus)

{
  size_t sVar1;
  BignumInt *pBVar2;
  uint uVar3;
  mp_int *n;
  mp_int *r_out;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  ulong uVar9;
  BignumInt flip;
  ulong uVar10;
  
  uVar4 = y->nw;
  if (y->nw < x->nw) {
    uVar4 = x->nw;
  }
  n = mp_make_sized(uVar4);
  mp_add_masked_into(n->w,n->nw,x,y,0xffffffffffffffff,0xffffffffffffffff,1);
  uVar3 = mp_cmp_hs(y,x);
  uVar4 = (ulong)uVar3;
  uVar10 = -uVar4;
  sVar1 = n->nw;
  if (sVar1 != 0) {
    pBVar2 = n->w;
    sVar5 = 0;
    uVar6 = uVar4;
    do {
      uVar7 = pBVar2[sVar5] ^ uVar10;
      BVar8 = uVar7 + uVar6;
      uVar6 = (ulong)CARRY8(uVar7,uVar6);
      pBVar2[sVar5] = BVar8;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  r_out = mp_make_sized(modulus->nw);
  mp_divmod_into(n,modulus,(mp_int *)0x0,r_out);
  uVar6 = r_out->nw;
  if (uVar6 != 0) {
    pBVar2 = r_out->w;
    uVar7 = 0;
    do {
      uVar9 = pBVar2[uVar7] ^ uVar10;
      BVar8 = uVar9 + uVar4;
      uVar4 = (ulong)CARRY8(uVar9,uVar4);
      pBVar2[uVar7] = BVar8;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  uVar4 = 0;
  uVar10 = 0;
  do {
    if (uVar10 < uVar6) {
      BVar8 = r_out->w[uVar10];
    }
    else {
      BVar8 = 0;
    }
    uVar4 = uVar4 | BVar8;
    uVar10 = uVar10 + 1;
  } while (uVar6 + (uVar6 == 0) != uVar10);
  mp_add_masked_into(r_out->w,uVar6,r_out,modulus,
                     -(ulong)(~(uint)((uVar4 & 1) == 0 && uVar4 >> 1 == 0) & uVar3),0,0);
  mp_free(n);
  return r_out;
}

Assistant:

mp_int *mp_modsub(mp_int *x, mp_int *y, mp_int *modulus)
{
    mp_int *diff = mp_make_sized(size_t_max(x->nw, y->nw));
    mp_sub_into(diff, x, y);
    unsigned negate = mp_cmp_hs(y, x);
    mp_cond_negate(diff, diff, negate);
    mp_int *residue = mp_mod(diff, modulus);
    mp_cond_negate(residue, residue, negate);
    /* If we've just negated the residue, then it will be < 0 and need
     * the modulus adding to it to make it positive - *except* if the
     * residue was zero when we negated it. */
    unsigned make_positive = negate & ~mp_eq_integer(residue, 0);
    mp_cond_add_into(residue, residue, modulus, make_positive);
    mp_free(diff);
    return residue;
}